

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O0

void anon_unknown.dwarf_2fa16::assert_in1(void)

{
  initializer_list<int> __l;
  string expected;
  string msg;
  TestFailure *e;
  string local_98 [32];
  Assert local_78;
  Assert local_68 [2];
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> v;
  
  local_40[0] = 0;
  local_40[1] = 1;
  local_40[2] = 2;
  local_40[3] = 3;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  UnitTests::Assert::Assert
            (local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
             ,0x104);
  UnitTests::Assert::In<int,std::vector<int,std::allocator<int>>&>
            (local_68,10,(vector<int,_std::allocator<int>_> *)local_20);
  UnitTests::Assert::Assert
            (&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
             ,0x105);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"ASSERT_IN should have fired here.",(allocator *)((long)&e + 7));
  UnitTests::Assert::Fail(&local_78,(string *)local_98);
}

Assistant:

TEST(assert_in1)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            ASSERT_IN(10, v);
            FAIL("ASSERT_IN should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg = e.what();
            std::string expected =
                "error A1000: Assertion failure : Expected container to contain 10, actual contents :\n"
                "\t[0, 1, 2, 3]";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_IN", __FILE__, __LINE__);
            }
        }
    }